

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O3

void __thiscall
pbrt::
HashMap<pbrt::LightHandle,_unsigned_long,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
::Insert(HashMap<pbrt::LightHandle,_unsigned_long,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
         *this,LightHandle *key,unsigned_long *value)

{
  unsigned_long uVar1;
  size_t sVar2;
  optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *poVar3;
  size_t sVar4;
  
  sVar2 = FindOffset(this,key);
  poVar3 = (this->table).ptr;
  if ((poVar3[sVar2].set == false) &&
     (sVar4 = this->nStored + 1, this->nStored = sVar4, (this->table).nStored < sVar4 * 3)) {
    Grow(this);
    sVar2 = FindOffset(this,key);
    poVar3 = (this->table).ptr;
  }
  uVar1 = *value;
  poVar3[sVar2].optionalValue.__align =
       (anon_struct_8_0_00000001_for___align)
       (key->
       super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
       ).bits;
  *(unsigned_long *)((long)&poVar3[sVar2].optionalValue + 8) = uVar1;
  poVar3[sVar2].set = true;
  return;
}

Assistant:

void Insert(const Key &key, const Value &value) {
        size_t offset = FindOffset(key);
        if (table[offset].has_value() == false) {
            // Grow hash table if it is too full
            if (3 * ++nStored > capacity()) {
                Grow();
                offset = FindOffset(key);
            }
        }
        table[offset] = std::make_pair(key, value);
    }